

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O0

ENUM__mathml__cn__type
COLLADASaxFWL15::toEnum_ENUM__mathml__cn__type
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  ENUM__mathml__cn__type EVar1;
  _func_unsigned_long_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_RDI;
  
  EVar1 = GeneratedSaxParser::Utils::
          toEnum<COLLADASaxFWL15::ENUM__mathml__cn__type,_unsigned_long,_(COLLADASaxFWL15::ENUM__mathml__cn__type)7>
                    ((ParserChar **)bufferEnd,failed,(bool *)enumMap,
                     (pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *)
                     baseConversionFunc,in_RDI);
  return EVar1;
}

Assistant:

ENUM__mathml__cn__type toEnum_ENUM__mathml__cn__type (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__mathml__cn__type>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__mathml__cn__type, StringHash, ENUM__mathml__cn__type__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}